

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindConcatFunctionInternal
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,bool is_operator)

{
  LogicalTypeId LVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  pointer pEVar5;
  LogicalType *pLVar6;
  ParameterNotResolvedException *pPVar7;
  BinderException *pBVar8;
  type pEVar9;
  reference this_00;
  ulong __n;
  byte bVar10;
  pointer puVar11;
  bool local_eb;
  bool is_operator_local;
  allocator local_e9;
  LogicalType list_type;
  string local_a8;
  ClientContext *local_88;
  LogicalType child_type;
  string local_68;
  LogicalType next_type;
  
  puVar2 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  bVar10 = is_operator;
  is_operator_local = is_operator;
  local_88 = context;
  for (puVar11 = (arguments->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2; puVar11 = puVar11 + 1
      ) {
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    if ((pEVar5->return_type).id_ == UNKNOWN) {
      pPVar7 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(pPVar7);
      __cxa_throw(pPVar7,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    if (((pEVar5->return_type).id_ == LIST) ||
       (pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(puVar11), (pEVar5->return_type).id_ == ARRAY)) {
      bVar4 = true;
    }
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    bVar10 = bVar10 & (pEVar5->return_type).id_ == BLOB;
  }
  if (bVar4) {
    local_eb = is_operator;
    LogicalType::LogicalType(&child_type,SQLNULL);
    puVar2 = (arguments->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = true;
    for (puVar11 = (arguments->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
        puVar11 = puVar11 + 1) {
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar11);
      LogicalType::LogicalType(&list_type,SQLNULL);
      pLVar6 = &pEVar5->return_type;
      bVar3 = LogicalType::operator==(pLVar6,&list_type);
      LogicalType::~LogicalType(&list_type);
      if (!bVar3) {
        LogicalType::LogicalType(&next_type,INVALID);
        LVar1 = pLVar6->id_;
        if (LVar1 == LIST) {
          pLVar6 = ListType::GetChildType(pLVar6);
        }
        else {
          if (LVar1 != ARRAY) {
            if (LVar1 == UNKNOWN) {
              pPVar7 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
              ParameterNotResolvedException::ParameterNotResolvedException(pPVar7);
              __cxa_throw(pPVar7,&ParameterNotResolvedException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            list_type._0_8_ =
                 &list_type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            list_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            list_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_1_ = 0;
            for (__n = 0; __n < (ulong)((long)(arguments->
                                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              ).
                                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(arguments->
                                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              ).
                                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3);
                __n = __n + 1) {
              if (list_type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                ::std::__cxx11::string::append((char *)&list_type);
              }
              this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        ::get<true>(arguments,__n);
              pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->(this_00);
              LogicalType::ToString_abi_cxx11_(&local_a8,&pEVar5->return_type);
              ::std::__cxx11::string::append((string *)&list_type);
              ::std::__cxx11::string::~string((string *)&local_a8);
            }
            pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
            pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator*(puVar11);
            ::std::__cxx11::string::string
                      ((string *)&local_a8,
                       "Cannot concatenate types %s - an explicit cast is required",&local_e9);
            ::std::__cxx11::string::string((string *)&local_68,(string *)&list_type);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar8,pEVar9,(string *)&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_68);
            __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pLVar6 = ArrayType::GetChildType(pLVar6);
        }
        LogicalType::operator=(&next_type,pLVar6);
        bVar4 = LogicalType::TryGetMaxLogicalType(local_88,&child_type,&next_type,&child_type);
        if (!bVar4) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(puVar11);
          ::std::__cxx11::string::string
                    ((string *)&list_type,
                     "Cannot concatenate lists of types %s[] and %s[] - an explicit cast is required"
                     ,&local_e9);
          LogicalType::ToString_abi_cxx11_(&local_a8,&child_type);
          LogicalType::ToString_abi_cxx11_(&local_68,&next_type);
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar8,pEVar9,(string *)&list_type,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68)
          ;
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::~LogicalType(&next_type);
        bVar4 = false;
      }
    }
    if (bVar4) {
      LogicalType::LogicalType(&list_type,SQLNULL);
      SetArgumentType(bound_function,&list_type,local_eb);
      LogicalType::~LogicalType(&list_type);
      make_uniq<duckdb::ConcatFunctionData,duckdb::LogicalType&,bool&>
                ((duckdb *)&list_type,&(bound_function->super_BaseScalarFunction).return_type,
                 &local_eb);
      *(undefined8 *)this = list_type._0_8_;
    }
    else {
      LogicalType::LIST(&list_type,&child_type);
      SetArgumentType(bound_function,&list_type,local_eb);
      make_uniq<duckdb::ConcatFunctionData,duckdb::LogicalType&,bool&>
                ((duckdb *)&local_a8,&(bound_function->super_BaseScalarFunction).return_type,
                 &local_eb);
      *(pointer *)this = local_a8._M_dataplus._M_p;
      LogicalType::~LogicalType(&list_type);
    }
    LogicalType::~LogicalType(&child_type);
  }
  else {
    LogicalType::LogicalType(&list_type,(bVar10 & 1) + VARCHAR);
    SetArgumentType(bound_function,&list_type,is_operator);
    LogicalType::~LogicalType(&list_type);
    make_uniq<duckdb::ConcatFunctionData,duckdb::LogicalType&,bool&>
              ((duckdb *)&list_type,&(bound_function->super_BaseScalarFunction).return_type,
               &is_operator_local);
    *(undefined8 *)this = list_type._0_8_;
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>)this;
}

Assistant:

static unique_ptr<FunctionData> BindConcatFunctionInternal(ClientContext &context, ScalarFunction &bound_function,
                                                           vector<unique_ptr<Expression>> &arguments,
                                                           bool is_operator) {
	bool list_concat = false;
	// blob concat is only supported for the concat operator - regular concat converts to varchar
	bool all_blob = is_operator ? true : false;
	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
		if (arg->return_type.id() == LogicalTypeId::LIST || arg->return_type.id() == LogicalTypeId::ARRAY) {
			list_concat = true;
		}
		if (arg->return_type.id() != LogicalTypeId::BLOB) {
			all_blob = false;
		}
	}
	if (list_concat) {
		return BindListConcat(context, bound_function, arguments, is_operator);
	}
	auto return_type = all_blob ? LogicalType::BLOB : LogicalType::VARCHAR;

	// we can now assume that the input is a string or castable to a string
	SetArgumentType(bound_function, return_type, is_operator);
	return make_uniq<ConcatFunctionData>(bound_function.return_type, is_operator);
}